

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNIsIn::gen_code(CTPNIsIn *this,int discard,int param_2)

{
  int iVar1;
  CTcGenTarg *pCVar2;
  CTcCodeLabel *in_RAX;
  CTcCodeLabel *lbl;
  CTcPrsNode *pCVar3;
  CTcCodeLabel *local_38;
  
  lbl = CTcCodeStream::new_label_fwd(G_cs);
  local_38 = in_RAX;
  if ((discard == 0) && (((this->super_CTPNIsInBase).field_0x18 & 1) == 0)) {
    local_38 = CTcCodeStream::new_label_fwd(G_cs);
  }
  pCVar3 = (this->super_CTPNIsInBase).super_CTPNBin.super_CTPNBinBase.left_;
  (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
  pCVar3 = (this->super_CTPNIsInBase).super_CTPNBin.super_CTPNBinBase.right_;
  while (pCVar3 = (CTcPrsNode *)pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,
        pCVar3 != (CTcPrsNode *)0x0) {
    CTcGenTarg::write_op(G_cg,0x88);
    (**(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar3,0,0);
    CTcGenTarg::write_op(G_cg,0x94);
    CTcCodeStream::write_ofs2(G_cs,lbl,0);
    pCVar2 = G_cg;
    iVar1 = G_cg->sp_depth_;
    if (G_cg->max_sp_depth_ <= iVar1) {
      G_cg->max_sp_depth_ = iVar1 + 1;
    }
    pCVar2->sp_depth_ = iVar1 + -1;
  }
  if ((discard == 0) && (((this->super_CTPNIsInBase).field_0x18 & 1) == 0)) {
    CTcGenTarg::write_op(G_cg,0x89);
    CTcGenTarg::write_op(G_cg,'\b');
    CTcGenTarg::write_op(G_cg,0x91);
    CTcCodeStream::write_ofs2(G_cs,local_38,0);
  }
  CTcPrsNode::def_label_pos(lbl);
  CTcGenTarg::write_op(G_cg,0x89);
  if (discard == 0) {
    CTcGenTarg::write_op(G_cg,'\t');
    if (((this->super_CTPNIsInBase).field_0x18 & 1) == 0) {
      CTcPrsNode::def_label_pos(local_38);
      return;
    }
  }
  else {
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  return;
}

Assistant:

void CTPNIsIn::gen_code(int discard, int)
{
    CTPNArglist *lst;
    CTPNArg *arg;
    CTcCodeLabel *lbl_found;
    CTcCodeLabel *lbl_done;

    /* allocate our 'found' label */
    lbl_found = G_cs->new_label_fwd();

    /* 
     *   allocate our 'done' label - we only need to do this if we don't
     *   have a constant true value and we're not discarding the result
     */
    if (!const_true_ && !discard)
        lbl_done = G_cs->new_label_fwd();

    /* generate my left-side expression */
    left_->gen_code(FALSE, FALSE);

    /* the right side is always an argument list */
    lst = (CTPNArglist *)right_;

    /* compare to each element in the list on the right */
    for (arg = lst->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg())
    {
        /* 
         *   duplicate the left-side value, so we don't have to generate
         *   it again for this comparison 
         */
        G_cg->write_op(OPC_DUP);

        /* generate this list element */
        arg->gen_code(FALSE, FALSE);

        /* if they're equal, jump to the 'found' label */
        G_cg->write_op(OPC_JE);
        G_cs->write_ofs2(lbl_found, 0);

        /* we pushed one more (DUP) and popped two (JE) */
        G_cg->note_push(1);
        G_cg->note_pop(2);
    }

    /* 
     *   Generate the code that comes at the end of all of tests when we
     *   fail to find any matches - we simply discard the left-side value
     *   from the stack, push our 'nil' value, and jump to the end label.
     *   
     *   If we have a constant 'true' value, there's no need to do any of
     *   this, because we know that, even after testing all of our
     *   non-constant values, there's a constant value that makes the
     *   entire expression true, and we can thus just fall through to the
     *   'found' code.
     *   
     *   If we're discarding the result, there's no need to push a
     *   separate value for the result, so we can just fall through to the
     *   common ending code in this case.  
     */
    if (!const_true_ && !discard)
    {
        G_cg->write_op(OPC_DISC);
        G_cg->write_op(OPC_PUSHNIL);
        G_cg->write_op(OPC_JMP);
        G_cs->write_ofs2(lbl_done, 0);
    }

    /* 
     *   Generate the 'found' code - this discards the left-side value and
     *   pushes our 'true' result.  Note that there's no reason to push
     *   our result if we're discarding it.  
     */
    def_label_pos(lbl_found);
    G_cg->write_op(OPC_DISC);

    /* 
     *   if we're discarding the result, just note the pop of the left
     *   value; otherwise, push our result 
     */
    if (discard)
        G_cg->note_pop();
    else
        G_cg->write_op(OPC_PUSHTRUE);

    /* our 'done' label is here, if we needed one */
    if (!const_true_ && !discard)
        def_label_pos(lbl_done);
}